

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O0

void stressing_multi_threads(int threadNum)

{
  ostream *this;
  int in_EDI;
  int i_1;
  shared_ptr<Thread> tmp;
  int i;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> vsp;
  int local_48;
  value_type *in_stack_ffffffffffffffc8;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>
  *in_stack_ffffffffffffffd0;
  int local_24;
  Thread *in_stack_ffffffffffffffe0;
  pointer in_stack_ffffffffffffffe8;
  
  this = std::operator<<((ostream *)&std::cout,
                         "-------------------stressing test multi thread------------------");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::vector
            ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)0x103ec4)
  ;
  for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
    std::make_shared<Thread,void(&)(),char_const(&)[9]>
              ((_func_void *)in_stack_ffffffffffffffe8,&in_stack_ffffffffffffffe0->started_);
    std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::push_back
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::shared_ptr<Thread>::~shared_ptr((shared_ptr<Thread> *)0x103f0b);
  }
  for (local_48 = 0; local_48 < in_EDI; local_48 = local_48 + 1) {
    std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::operator[]
              ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)
               &stack0xffffffffffffffe0,(long)local_48);
    std::__shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x103f68);
    Thread::start(in_stack_ffffffffffffffe0);
  }
  sleep(3);
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::~vector
            (in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void stressing_multi_threads(int threadNum =4){
    // threadNum * 100000 lines
    cout<<"-------------------stressing test multi thread------------------"<<endl;
    vector<shared_ptr<Thread>> vsp;
    for (int i=0; i<threadNum; ++i) {
        shared_ptr<Thread> tmp = make_shared<Thread>(threadFunc, "testFunc");
        vsp.push_back(tmp);
    }   
    for (int i=0; i<threadNum; ++i) {
        vsp[i]->start();
    }
    sleep(3);
}